

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall clog::Logger::Impl::finish(Impl *this)

{
  self *psVar1;
  LogStream *pLVar2;
  Impl *this_local;
  
  psVar1 = LogStream::operator<<(&this->_stream," - ");
  pLVar2 = operator<<(psVar1,this->_file);
  psVar1 = LogStream::operator<<(pLVar2,":");
  pLVar2 = LogStream::operator<<(psVar1,this->_line);
  LogStream::operator<<(pLVar2,"\n");
  return;
}

Assistant:

void Logger::Impl::finish()
{
    _stream << " - " << _file << ":" << _line << "\n\0"; 
}